

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

JSValue js_std_open(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  char *__filename;
  char *__s;
  size_t sVar1;
  FILE *f;
  uint *puVar2;
  ulong uVar3;
  ulong uVar4;
  int64_t iVar5;
  char *ptr;
  JSValue JVar6;
  JSValue JVar7;
  JSValue val;
  
  __filename = JS_ToCStringLen2(ctx,(size_t *)0x0,*argv,0);
  ptr = (char *)0x0;
  if (__filename == (char *)0x0) {
LAB_00112262:
    JS_FreeCString(ctx,__filename);
    JS_FreeCString(ctx,ptr);
    iVar5 = 6;
  }
  else {
    __s = JS_ToCStringLen2(ctx,(size_t *)0x0,argv[1],0);
    ptr = (char *)0x0;
    if (__s == (char *)0x0) goto LAB_00112262;
    sVar1 = strspn(__s,"rwa+b");
    if (__s[sVar1] != '\0') {
      JS_ThrowTypeError(ctx,"invalid file mode");
      ptr = __s;
      goto LAB_00112262;
    }
    f = fopen(__filename,__s);
    if (f == (FILE *)0x0) {
      puVar2 = (uint *)__errno_location();
      uVar3 = (ulong)*puVar2;
    }
    else {
      uVar3 = 0;
    }
    if ((2 < argc) && ((int)argv[2].tag != 3)) {
      JVar7.tag = argv[2].tag;
      JVar7.u.ptr = argv[2].u.ptr;
      val.tag = 0;
      val.u.float64 = (double)uVar3;
      JS_SetPropertyStr(ctx,JVar7,"errno",val);
    }
    JS_FreeCString(ctx,__filename);
    JS_FreeCString(ctx,__s);
    if (f != (FILE *)0x0) {
      JVar7 = js_new_std_file(ctx,(FILE *)f,1,0);
      iVar5 = JVar7.tag;
      uVar4 = (ulong)JVar7.u.ptr & 0xffffffff00000000;
      uVar3 = (ulong)JVar7.u._0_4_;
      goto LAB_00112281;
    }
    iVar5 = 2;
  }
  uVar3 = 0;
  uVar4 = 0;
LAB_00112281:
  JVar6.u.ptr = (void *)(uVar3 | uVar4);
  JVar6.tag = iVar5;
  return JVar6;
}

Assistant:

static JSValue js_std_open(JSContext *ctx, JSValueConst this_val,
                           int argc, JSValueConst *argv)
{
    const char *filename, *mode = NULL;
    FILE *f;
    int err;
    
    filename = JS_ToCString(ctx, argv[0]);
    if (!filename)
        goto fail;
    mode = JS_ToCString(ctx, argv[1]);
    if (!mode)
        goto fail;
    if (mode[strspn(mode, "rwa+b")] != '\0') {
        JS_ThrowTypeError(ctx, "invalid file mode");
        goto fail;
    }

    f = fopen(filename, mode);
    if (!f)
        err = errno;
    else
        err = 0;
    if (argc >= 3)
        js_set_error_object(ctx, argv[2], err);
    JS_FreeCString(ctx, filename);
    JS_FreeCString(ctx, mode);
    if (!f)
        return JS_NULL;
    return js_new_std_file(ctx, f, TRUE, FALSE);
 fail:
    JS_FreeCString(ctx, filename);
    JS_FreeCString(ctx, mode);
    return JS_EXCEPTION;
}